

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

void __thiscall
cmServerProtocol1::HandleCMakeFileChanges(cmServerProtocol1 *this,string *path,int event,int status)

{
  Value *pVVar1;
  Value obj;
  Value local_c0;
  Value properties;
  Value local_70;
  Value local_48;
  
  if (status == 0) {
    if (this->m_isDirty == false) {
      this->m_isDirty = true;
      Json::Value::Value(&obj,objectValue);
      cmServerProtocol::SendSignal(&this->super_cmServerProtocol,&kDIRTY_SIGNAL_abi_cxx11_,&obj);
      Json::Value::~Value(&obj);
    }
    Json::Value::Value(&obj,objectValue);
    Json::Value::Value(&local_48,path);
    pVVar1 = Json::Value::operator[](&obj,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar1,&local_48);
    Json::Value::~Value(&local_48);
    Json::Value::Value(&properties,arrayValue);
    if ((event & 1U) != 0) {
      Json::Value::Value(&local_c0,&kRENAME_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append(&properties,&local_c0);
      Json::Value::~Value(&local_c0);
    }
    if ((event & 2U) != 0) {
      Json::Value::Value(&local_c0,&kCHANGE_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append(&properties,&local_c0);
      Json::Value::~Value(&local_c0);
    }
    Json::Value::Value(&local_70,&properties);
    pVVar1 = Json::Value::operator[](&obj,&kPROPERTIES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar1,&local_70);
    Json::Value::~Value(&local_70);
    cmServerProtocol::SendSignal(&this->super_cmServerProtocol,&kFILE_CHANGE_SIGNAL_abi_cxx11_,&obj)
    ;
    Json::Value::~Value(&properties);
    Json::Value::~Value(&obj);
    return;
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx"
                ,0x167,
                "void cmServerProtocol1::HandleCMakeFileChanges(const std::string &, int, int)");
}

Assistant:

void cmServerProtocol1::HandleCMakeFileChanges(const std::string& path,
                                               int event, int status)
{
  assert(status == 0);
  static_cast<void>(status);

  if (!m_isDirty) {
    m_isDirty = true;
    SendSignal(kDIRTY_SIGNAL, Json::objectValue);
  }
  Json::Value obj = Json::objectValue;
  obj[kPATH_KEY] = path;
  Json::Value properties = Json::arrayValue;
  if (event & UV_RENAME) {
    properties.append(kRENAME_PROPERTY_VALUE);
  }
  if (event & UV_CHANGE) {
    properties.append(kCHANGE_PROPERTY_VALUE);
  }

  obj[kPROPERTIES_KEY] = properties;
  SendSignal(kFILE_CHANGE_SIGNAL, obj);
}